

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_make_listen_socket_ipv6only(int sock)

{
  int iVar1;
  int one;
  undefined1 local_4 [4];
  
  iVar1 = setsockopt(sock,0x29,0x1a,local_4,4);
  return iVar1;
}

Assistant:

int
evutil_make_listen_socket_ipv6only(evutil_socket_t sock)
{
#if defined(IPV6_V6ONLY)
	int one = 1;
	return setsockopt(sock, IPPROTO_IPV6, IPV6_V6ONLY, (void*) &one,
	    (ev_socklen_t)sizeof(one));
#endif
	return 0;
}